

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartPtr.hpp
# Opt level: O2

SmartPtr<Lib::SubscriptionObject> * __thiscall
Lib::SmartPtr<Lib::SubscriptionObject>::operator=
          (SmartPtr<Lib::SubscriptionObject> *this,SmartPtr<Lib::SubscriptionObject> *ptr)

{
  SubscriptionObject *x;
  RefCounter *ptr_00;
  SubscriptionObject *pSVar1;
  RefCounter *pRVar2;
  
  x = this->_obj;
  ptr_00 = this->_refCnt;
  pSVar1 = ptr->_obj;
  this->_obj = pSVar1;
  pRVar2 = ptr->_refCnt;
  this->_refCnt = pRVar2;
  if (pRVar2 != (RefCounter *)0x0 && pSVar1 != (SubscriptionObject *)0x0) {
    pRVar2->_val = pRVar2->_val + 1;
  }
  if ((ptr_00 != (RefCounter *)0x0 && x != (SubscriptionObject *)0x0) &&
     (ptr_00->_val = ptr_00->_val + -1, ptr_00->_val == 0)) {
    checked_delete<Lib::SubscriptionObject>(x);
    RefCounter::operator_delete(ptr_00,4);
  }
  return this;
}

Assistant:

SmartPtr& operator=(const SmartPtr& ptr)
  {
    T* oldObj=_obj;
    RefCounter* oldCnt=_refCnt;
    _obj=ptr._obj;
    _refCnt=ptr._refCnt;

    if(_obj && _refCnt) {
      (_refCnt->_val)++;
    }

    if(oldObj && oldCnt) {
      (oldCnt->_val)--;
      ASS(oldCnt->_val >= 0);
      if(! oldCnt->_val) {
        checked_delete(oldObj);
        delete oldCnt;
      }
    }
    return *this;
  }